

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O0

RecyclableObject *
TTD::NSSnapObjects::DoObjectInflation_SnapAsyncFunction(SnapObject *snpObject,InflateMap *inflator)

{
  ScriptContext *this;
  SnapGeneratorFunctionInfo *pSVar1;
  JavascriptLibrary *this_00;
  RecyclableObject *pRVar2;
  JavascriptAsyncFunction *func;
  SnapGeneratorFunctionInfo *info;
  ScriptContext *ctx;
  InflateMap *inflator_local;
  SnapObject *snpObject_local;
  
  this = InflateMap::LookupScriptContext(inflator,snpObject->SnapType->ScriptContextLogId);
  pSVar1 = SnapObjectGetAddtlInfoAs<TTD::NSSnapObjects::SnapGeneratorFunctionInfo*,(TTD::NSSnapObjects::SnapObjectType)36>
                     (snpObject);
  this_00 = Js::ScriptContext::GetLibrary(this);
  pRVar2 = (RecyclableObject *)
           Js::JavascriptLibrary::CreateAsyncFunction
                     (this_00,Js::JavascriptAsyncFunction::EntryAsyncFunctionImplementation,
                      (bool)(pSVar1->isAnonymousFunction & 1));
  return pRVar2;
}

Assistant:

Js::RecyclableObject* DoObjectInflation_SnapAsyncFunction(const SnapObject *snpObject, InflateMap *inflator)
        {
            Js::ScriptContext* ctx = inflator->LookupScriptContext(snpObject->SnapType->ScriptContextLogId);
            SnapGeneratorFunctionInfo* info = SnapObjectGetAddtlInfoAs<SnapGeneratorFunctionInfo *, SnapObjectType::SnapAsyncFunction>(snpObject);
            Js::JavascriptAsyncFunction* func = ctx->GetLibrary()->CreateAsyncFunction(Js::JavascriptAsyncFunction::EntryAsyncFunctionImplementation, info->isAnonymousFunction);
            return func;
        }